

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void Omega_h::fill<signed_char>(Write<signed_char> *a,char val)

{
  Alloc *pAVar1;
  LO n;
  type f;
  type local_30;
  
  Write<signed_char>::Write(&local_30.a,a);
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    n = (LO)pAVar1->size;
  }
  else {
    n = (LO)((ulong)pAVar1 >> 3);
  }
  local_30.val = val;
  parallel_for<Omega_h::fill<signed_char>(Omega_h::Write<signed_char>,signed_char)::_lambda(int)_1_>
            (n,&local_30,"Write(size,value)");
  Write<signed_char>::~Write(&local_30.a);
  return;
}

Assistant:

void fill(Write<T> a, T val) {
  auto f = OMEGA_H_LAMBDA(LO i) { a[i] = val; };
  parallel_for(a.size(), f, "Write(size,value)");
}